

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O2

ngx_chain_t * ngx_create_chain_of_bufs(ngx_pool_t *pool,ngx_bufs_t *bufs)

{
  u_char *puVar1;
  ngx_buf_t *pnVar2;
  ngx_chain_t *pnVar3;
  ngx_chain_t **ppnVar4;
  ngx_chain_t *local_40;
  ngx_chain_t *chain;
  
  puVar1 = (u_char *)ngx_palloc(pool,bufs->size * bufs->num);
  if (puVar1 == (u_char *)0x0) {
LAB_001155f8:
    local_40 = (ngx_chain_t *)0x0;
  }
  else {
    ppnVar4 = &local_40;
    for (chain = (ngx_chain_t *)0x0; (long)chain < bufs->num;
        chain = (ngx_chain_t *)((long)&chain->buf + 1)) {
      pnVar2 = (ngx_buf_t *)ngx_pcalloc(pool,0x50);
      if (pnVar2 == (ngx_buf_t *)0x0) goto LAB_001155f8;
      pnVar2->pos = puVar1;
      pnVar2->last = puVar1;
      pnVar2->field_0x48 = pnVar2->field_0x48 | 1;
      pnVar2->start = puVar1;
      puVar1 = puVar1 + bufs->size;
      pnVar2->end = puVar1;
      pnVar3 = ngx_alloc_chain_link(pool);
      if (pnVar3 == (ngx_chain_t *)0x0) goto LAB_001155f8;
      pnVar3->buf = pnVar2;
      *ppnVar4 = pnVar3;
      ppnVar4 = &pnVar3->next;
    }
    *ppnVar4 = (ngx_chain_t *)0x0;
  }
  return local_40;
}

Assistant:

ngx_chain_t *
ngx_create_chain_of_bufs(ngx_pool_t *pool, ngx_bufs_t *bufs)
{
    u_char       *p;
    ngx_int_t     i;
    ngx_buf_t    *b;
    ngx_chain_t  *chain, *cl, **ll;

    p = ngx_palloc(pool, bufs->num * bufs->size);
    if (p == NULL) {
        return NULL;
    }

    ll = &chain;

    for (i = 0; i < bufs->num; i++) {

        b = ngx_calloc_buf(pool);
        if (b == NULL) {
            return NULL;
        }

        /*
         * set by ngx_calloc_buf():
         *
         *     b->file_pos = 0;
         *     b->file_last = 0;
         *     b->file = NULL;
         *     b->shadow = NULL;
         *     b->tag = 0;
         *     and flags
         *
         */

        b->pos = p;
        b->last = p;
        b->temporary = 1;

        b->start = p;
        p += bufs->size;
        b->end = p;

        cl = ngx_alloc_chain_link(pool);
        if (cl == NULL) {
            return NULL;
        }

        cl->buf = b;
        *ll = cl;
        ll = &cl->next;
    }

    *ll = NULL;

    return chain;
}